

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkStatement(cmNinjaNormalTargetGenerator *this)

{
  cmNinjaVars *this_00;
  cmGeneratorTarget *target;
  cmMakefile *pcVar1;
  cmLocalNinjaGenerator *pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  bool bVar4;
  int iVar5;
  cmGlobalNinjaGenerator *this_01;
  string *psVar6;
  string *psVar7;
  cmGeneratedFileStream *pcVar8;
  ostream *poVar9;
  char *pcVar10;
  mapped_type *pmVar11;
  mapped_type *flags;
  mapped_type *linkFlags;
  size_t sVar12;
  cmOutputConverter *outputConverter;
  bool usedResponseFile;
  allocator<char> local_2f1;
  string objPath;
  key_type local_2c8;
  TargetType local_2a4;
  cmNinjaLinkLineDeviceComputer *local_2a0;
  cmLocalNinjaGenerator *local_298;
  cmGlobalNinjaGenerator *local_290;
  cmOutputConverter *local_288;
  string *local_280;
  key_type local_278;
  string cfgName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string targetOutputReal;
  string cudaLinkLanguage;
  string linkPath;
  string frameworkPath;
  cmNinjaBuild build;
  string createRule;
  string targetOutputImplib;
  string local_50;
  
  this_01 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&build,"CUDA",(allocator<char> *)&objPath);
  local_290 = this_01;
  bVar4 = cmGlobalGenerator::GetLanguageEnabled((cmGlobalGenerator *)this_01,&build.Comment);
  std::__cxx11::string::~string((string *)&build);
  if (bVar4) {
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    bVar4 = requireDeviceLinking
                      (target,(cmLocalGenerator *)
                              (this->super_cmNinjaTargetGenerator).LocalGenerator,
                       &(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        ConfigName);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cudaLinkLanguage,"CUDA",(allocator<char> *)&build);
      pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&build,"CMAKE_CUDA_OUTPUT_EXTENSION",(allocator<char> *)&objPath);
      psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&build.Comment);
      std::__cxx11::string::~string((string *)&build);
      psVar7 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      std::__cxx11::string::string((string *)&cfgName,(string *)psVar7);
      std::operator+(&objPath,&target->ObjectDirectory,"cmake_device_link");
      std::operator+(&build.Comment,&objPath,psVar6);
      cmNinjaTargetGenerator::ConvertToNinjaPath
                (&targetOutputReal,&this->super_cmNinjaTargetGenerator,&build.Comment);
      std::__cxx11::string::~string((string *)&build);
      std::__cxx11::string::~string((string *)&objPath);
      cmGeneratorTarget::GetFullPath(&build.Comment,target,&cfgName,ImportLibraryArtifact,false);
      cmNinjaTargetGenerator::ConvertToNinjaPath
                (&targetOutputImplib,&this->super_cmNinjaTargetGenerator,&build.Comment);
      std::__cxx11::string::~string((string *)&build);
      std::__cxx11::string::_M_assign((string *)&this->DeviceLinkObject);
      pcVar8 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::WriteDivider((ostream *)pcVar8);
      local_2a4 = cmGeneratorTarget::GetType(target);
      pcVar8 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      poVar9 = std::operator<<((ostream *)pcVar8,"# Device Link build statements for ");
      pcVar10 = cmState::GetTargetTypeName(local_2a4);
      poVar9 = std::operator<<(poVar9,pcVar10);
      poVar9 = std::operator<<(poVar9," target ");
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&build.Comment,&this->super_cmNinjaTargetGenerator);
      poVar9 = std::operator<<(poVar9,(string *)&build);
      std::operator<<(poVar9,"\n\n");
      std::__cxx11::string::~string((string *)&build);
      LanguageLinkerDeviceRule_abi_cxx11_(&local_50,this);
      cmNinjaBuild::cmNinjaBuild(&build,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::assign((char *)&build);
      GetVisibleTypeName(this);
      std::__cxx11::string::append((char *)&build);
      std::__cxx11::string::append((char *)&build);
      std::__cxx11::string::append((string *)&build);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&build.Outputs,&targetOutputReal);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&objPath,&(this->super_cmNinjaTargetGenerator).Objects);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&build.ExplicitDeps,&objPath);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&objPath);
      local_280 = &this->TargetLinkLanguage;
      cmNinjaTargetGenerator::ComputeLinkDeps
                ((cmNinjaDeps *)&objPath,&this->super_cmNinjaTargetGenerator,local_280);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&build.ImplicitDeps,&objPath);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&objPath);
      frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
      frameworkPath._M_string_length = 0;
      frameworkPath.field_2._M_local_buf[0] = '\0';
      linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
      linkPath._M_string_length = 0;
      linkPath.field_2._M_local_buf[0] = '\0';
      psVar6 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      cmGeneratorTarget::GetCreateRuleVariable(&createRule,target,local_280,psVar6);
      pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
      std::operator+(&objPath,&createRule,"_USE_WATCOM_QUOTE");
      bVar4 = cmMakefile::IsOn(pcVar1,&objPath);
      std::__cxx11::string::~string((string *)&objPath);
      local_298 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      local_288 = &(local_298->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter;
      cmOutputConverter::ConvertToOutputFormat(&objPath,local_288,&targetOutputReal,SHELL);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&usedResponseFile,"TARGET_FILE",(allocator<char> *)&local_2c8);
      this_00 = &build.Variables;
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_00,(key_type *)&usedResponseFile);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&objPath);
      std::__cxx11::string::~string((string *)&usedResponseFile);
      std::__cxx11::string::~string((string *)&objPath);
      local_2a0 = (cmNinjaLinkLineDeviceComputer *)operator_new(0x48);
      pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      outputConverter =
           &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
      if (pcVar2 == (cmLocalNinjaGenerator *)0x0) {
        outputConverter = (cmOutputConverter *)0x0;
      }
      cmLocalGenerator::GetStateSnapshot
                ((cmStateSnapshot *)&usedResponseFile,(cmLocalGenerator *)pcVar2);
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)&objPath,(cmStateSnapshot *)&usedResponseFile);
      cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
                (local_2a0,outputConverter,(cmStateDirectory *)&objPath,local_290);
      cmLinkLineComputer::SetUseWatcomQuote((cmLinkLineComputer *)local_2a0,bVar4);
      psVar6 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&objPath,"LINK_LIBRARIES",(allocator<char> *)&local_278);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_00,&objPath);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&usedResponseFile,"FLAGS",(allocator<char> *)&local_238);
      flags = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_00,(key_type *)&usedResponseFile);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c8,"LINK_FLAGS",&local_2f1);
      linkFlags = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_00,&local_2c8);
      cmLocalGenerator::GetTargetFlags
                ((cmLocalGenerator *)local_298,(cmLinkLineComputer *)local_2a0,psVar6,pmVar11,flags,
                 linkFlags,&frameworkPath,&linkPath,target);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&usedResponseFile);
      std::__cxx11::string::~string((string *)&objPath);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&objPath,"JOB_POOL_LINK",(allocator<char> *)&usedResponseFile);
      cmNinjaTargetGenerator::addPoolNinjaVariable
                (&this->super_cmNinjaTargetGenerator,&objPath,target,this_00);
      std::__cxx11::string::~string((string *)&objPath);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&usedResponseFile,"LINK_FLAGS",(allocator<char> *)&local_278);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_00,(key_type *)&usedResponseFile);
      cmGlobalNinjaGenerator::EncodeLiteral(&objPath,pmVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c8,"LINK_FLAGS",(allocator<char> *)&local_238);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_00,&local_2c8);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&objPath);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&objPath);
      std::__cxx11::string::~string((string *)&usedResponseFile);
      cmCommonTargetGenerator::GetManifests_abi_cxx11_(&objPath,(cmCommonTargetGenerator *)this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&usedResponseFile,"MANIFESTS",(allocator<char> *)&local_2c8);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_00,(key_type *)&usedResponseFile);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&objPath);
      std::__cxx11::string::~string((string *)&usedResponseFile);
      std::__cxx11::string::~string((string *)&objPath);
      std::operator+(&objPath,&frameworkPath,&linkPath);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&usedResponseFile,"LINK_PATH",(allocator<char> *)&local_2c8);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_00,(key_type *)&usedResponseFile);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&objPath);
      std::__cxx11::string::~string((string *)&usedResponseFile);
      std::__cxx11::string::~string((string *)&objPath);
      if (local_2a4 == EXECUTABLE) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&usedResponseFile,"FLAGS",(allocator<char> *)&local_2c8);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_00,(key_type *)&usedResponseFile);
        std::__cxx11::string::string((string *)&objPath,(string *)pmVar11);
        std::__cxx11::string::~string((string *)&usedResponseFile);
        cmLocalGenerator::AddArchitectureFlags
                  ((cmLocalGenerator *)local_298,&objPath,target,&cudaLinkLanguage,&cfgName);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&usedResponseFile,"FLAGS",(allocator<char> *)&local_2c8);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_00,(key_type *)&usedResponseFile);
        std::__cxx11::string::_M_assign((string *)pmVar11);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&usedResponseFile,"ARCH_FLAGS",(allocator<char> *)&local_2c8);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_00,(key_type *)&usedResponseFile);
        std::__cxx11::string::string((string *)&objPath,(string *)pmVar11);
        std::__cxx11::string::~string((string *)&usedResponseFile);
        cmLocalGenerator::AddArchitectureFlags
                  ((cmLocalGenerator *)local_298,&objPath,target,&cudaLinkLanguage,&cfgName);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&usedResponseFile,"ARCH_FLAGS",(allocator<char> *)&local_2c8);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_00,(key_type *)&usedResponseFile);
        std::__cxx11::string::_M_assign((string *)pmVar11);
        std::__cxx11::string::~string((string *)&usedResponseFile);
        objPath._M_string_length = 0;
        *objPath._M_dataplus._M_p = '\0';
        cmLocalGenerator::AddLanguageFlagsForLinking
                  ((cmLocalGenerator *)local_298,&objPath,target,&cudaLinkLanguage,&cfgName);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&usedResponseFile,"LANGUAGE_COMPILE_FLAGS",
                   (allocator<char> *)&local_2c8);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_00,(key_type *)&usedResponseFile);
        std::__cxx11::string::_M_assign((string *)pmVar11);
      }
      std::__cxx11::string::~string((string *)&usedResponseFile);
      std::__cxx11::string::~string((string *)&objPath);
      bVar4 = cmGeneratorTarget::HasSOName(target,&cfgName);
      if (bVar4) {
        cmMakefile::GetSONameFlag
                  ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile,
                   local_280);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&objPath,"SONAME_FLAG",(allocator<char> *)&usedResponseFile);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_00,&objPath);
        std::__cxx11::string::assign((char *)pmVar11);
        std::__cxx11::string::~string((string *)&objPath);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&objPath,"SONAME",(allocator<char> *)&usedResponseFile);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_00,&objPath);
        std::__cxx11::string::_M_assign((string *)pmVar11);
        std::__cxx11::string::~string((string *)&objPath);
        if (local_2a4 == SHARED_LIBRARY) {
          cmGeneratorTarget::GetInstallNameDirForBuildTree
                    (&objPath,(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                              GeneratorTarget,&cfgName);
          if (objPath._M_string_length != 0) {
            cmOutputConverter::ConvertToOutputFormat
                      ((string *)&usedResponseFile,local_288,&objPath,SHELL);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2c8,"INSTALLNAME_DIR",(allocator<char> *)&local_278);
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](this_00,&local_2c8);
            std::__cxx11::string::operator=((string *)pmVar11,(string *)&usedResponseFile);
            std::__cxx11::string::~string((string *)&local_2c8);
            std::__cxx11::string::~string((string *)&usedResponseFile);
          }
          std::__cxx11::string::~string((string *)&objPath);
        }
      }
      if ((this->TargetNames).ImportLibrary._M_string_length != 0) {
        cmOutputConverter::ConvertToOutputFormat(&objPath,local_288,&targetOutputImplib,SHELL);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&usedResponseFile,"TARGET_IMPLIB",(allocator<char> *)&local_2c8);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_00,(key_type *)&usedResponseFile);
        std::__cxx11::string::_M_assign((string *)pmVar11);
        std::__cxx11::string::~string((string *)&usedResponseFile);
        cmNinjaTargetGenerator::EnsureParentDirectoryExists
                  (&this->super_cmNinjaTargetGenerator,&objPath);
        std::__cxx11::string::~string((string *)&objPath);
      }
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
                (&objPath,(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
      pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      cmNinjaTargetGenerator::ConvertToNinjaPath
                (&local_2c8,&this->super_cmNinjaTargetGenerator,&objPath);
      cmOutputConverter::ConvertToOutputFormat
                ((string *)&usedResponseFile,
                 &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,&local_2c8,SHELL);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"OBJECT_DIR",(allocator<char> *)&local_238);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_00,&local_278);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&usedResponseFile);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&usedResponseFile);
      std::__cxx11::string::~string((string *)&local_2c8);
      cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&objPath);
      cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(&this->super_cmNinjaTargetGenerator,this_00);
      if (local_290->UsingGCCOnWindows == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&usedResponseFile,"LINK_LIBRARIES",(allocator<char> *)&local_2c8);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_00,(key_type *)&usedResponseFile);
        std::__cxx11::string::~string((string *)&usedResponseFile);
        _Var3._M_current = (pmVar11->_M_dataplus)._M_p;
        usedResponseFile = true;
        local_2c8._M_dataplus._M_p._0_1_ = 0x2f;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (_Var3,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(_Var3._M_current + pmVar11->_M_string_length),&usedResponseFile,
                   (char *)&local_2c8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&usedResponseFile,"LINK_PATH",(allocator<char> *)&local_2c8);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_00,(key_type *)&usedResponseFile);
        std::__cxx11::string::~string((string *)&usedResponseFile);
        _Var3._M_current = (pmVar11->_M_dataplus)._M_p;
        usedResponseFile = true;
        local_2c8._M_dataplus._M_p._0_1_ = 0x2f;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (_Var3,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(_Var3._M_current + pmVar11->_M_string_length),&usedResponseFile,
                   (char *)&local_2c8);
      }
      sVar12 = cmSystemTools::CalculateCommandLineLengthLimit();
      LanguageLinkerDeviceRule_abi_cxx11_((string *)&usedResponseFile,this);
      iVar5 = cmGlobalNinjaGenerator::GetRuleCmdLength(local_290,(string *)&usedResponseFile);
      std::__cxx11::string::~string((string *)&usedResponseFile);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"CMakeFiles/",&local_2f1);
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      std::operator+(&local_278,&local_238,psVar6);
      std::operator+(&local_2c8,&local_278,".rsp");
      cmNinjaTargetGenerator::ConvertToNinjaPath
                ((string *)&usedResponseFile,&this->super_cmNinjaTargetGenerator,&local_2c8);
      std::__cxx11::string::operator=((string *)&build.RspFile,(string *)&usedResponseFile);
      std::__cxx11::string::~string((string *)&usedResponseFile);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_238);
      cmLocalNinjaGenerator::AppendTargetDepends
                ((this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 &build.OrderOnlyDeps,DependOnTargetArtifact);
      usedResponseFile = false;
      pcVar8 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::WriteBuild
                (local_290,(ostream *)pcVar8,&build,(int)sVar12 - iVar5,&usedResponseFile);
      WriteDeviceLinkRule(this,usedResponseFile);
      std::__cxx11::string::~string((string *)&objPath);
      (*(local_2a0->super_cmLinkLineDeviceComputer).super_cmLinkLineComputer.
        _vptr_cmLinkLineComputer[1])();
      std::__cxx11::string::~string((string *)&createRule);
      std::__cxx11::string::~string((string *)&linkPath);
      std::__cxx11::string::~string((string *)&frameworkPath);
      cmNinjaBuild::~cmNinjaBuild(&build);
      std::__cxx11::string::~string((string *)&targetOutputImplib);
      std::__cxx11::string::~string((string *)&targetOutputReal);
      std::__cxx11::string::~string((string *)&cfgName);
      std::__cxx11::string::~string((string *)&cudaLinkLanguage);
    }
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkStatement()
{
  cmGlobalNinjaGenerator* globalGen = this->GetGlobalGenerator();
  if (!globalGen->GetLanguageEnabled("CUDA")) {
    return;
  }

  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();

  bool requiresDeviceLinking = requireDeviceLinking(
    *this->GeneratorTarget, *this->GetLocalGenerator(), this->ConfigName);
  if (!requiresDeviceLinking) {
    return;
  }

  // Now we can do device linking

  // First and very important step is to make sure while inside this
  // step our link language is set to CUDA
  std::string cudaLinkLanguage = "CUDA";
  std::string const& objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");

  std::string const cfgName = this->GetConfigName();
  std::string const targetOutputReal = ConvertToNinjaPath(
    genTarget->ObjectDirectory + "cmake_device_link" + objExt);

  std::string const targetOutputImplib = ConvertToNinjaPath(
    genTarget->GetFullPath(cfgName, cmStateEnums::ImportLibraryArtifact));

  this->DeviceLinkObject = targetOutputReal;

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetBuildFileStream());
  const cmStateEnums::TargetType targetType = genTarget->GetType();
  this->GetBuildFileStream() << "# Device Link build statements for "
                             << cmState::GetTargetTypeName(targetType)
                             << " target " << this->GetTargetName() << "\n\n";

  // Compute the comment.
  cmNinjaBuild build(this->LanguageLinkerDeviceRule());
  build.Comment = "Link the ";
  build.Comment += this->GetVisibleTypeName();
  build.Comment += " ";
  build.Comment += targetOutputReal;

  cmNinjaVars& vars = build.Variables;

  // Compute outputs.
  build.Outputs.push_back(targetOutputReal);
  // Compute specific libraries to link with.
  build.ExplicitDeps = this->GetObjects();
  build.ImplicitDeps = this->ComputeLinkDeps(this->TargetLinkLanguage);

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule = genTarget->GetCreateRuleVariable(
    this->TargetLinkLanguage, this->GetConfigName());
  const bool useWatcomQuote =
    this->GetMakefile()->IsOn(createRule + "_USE_WATCOM_QUOTE");
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(targetOutputReal, cmOutputConverter::SHELL);

  std::unique_ptr<cmLinkLineComputer> linkLineComputer(
    new cmNinjaLinkLineDeviceComputer(
      this->GetLocalGenerator(),
      this->GetLocalGenerator()->GetStateSnapshot().GetDirectory(),
      globalGen));
  linkLineComputer->SetUseWatcomQuote(useWatcomQuote);

  localGen.GetTargetFlags(
    linkLineComputer.get(), this->GetConfigName(), vars["LINK_LIBRARIES"],
    vars["FLAGS"], vars["LINK_FLAGS"], frameworkPath, linkPath, genTarget);

  this->addPoolNinjaVariable("JOB_POOL_LINK", genTarget, vars);

  vars["LINK_FLAGS"] =
    cmGlobalNinjaGenerator::EncodeLiteral(vars["LINK_FLAGS"]);

  vars["MANIFESTS"] = this->GetManifests();

  vars["LINK_PATH"] = frameworkPath + linkPath;

  // Compute architecture specific link flags.  Yes, these go into a different
  // variable for executables, probably due to a mistake made when duplicating
  // code between the Makefile executable and library generators.
  if (targetType == cmStateEnums::EXECUTABLE) {
    std::string t = vars["FLAGS"];
    localGen.AddArchitectureFlags(t, genTarget, cudaLinkLanguage, cfgName);
    vars["FLAGS"] = t;
  } else {
    std::string t = vars["ARCH_FLAGS"];
    localGen.AddArchitectureFlags(t, genTarget, cudaLinkLanguage, cfgName);
    vars["ARCH_FLAGS"] = t;
    t.clear();
    localGen.AddLanguageFlagsForLinking(t, genTarget, cudaLinkLanguage,
                                        cfgName);
    vars["LANGUAGE_COMPILE_FLAGS"] = t;
  }
  if (genTarget->HasSOName(cfgName)) {
    vars["SONAME_FLAG"] =
      this->GetMakefile()->GetSONameFlag(this->TargetLinkLanguage);
    vars["SONAME"] = this->TargetNames.SharedObject;
    if (targetType == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(cfgName);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  if (!this->TargetNames.ImportLibrary.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    EnsureParentDirectoryExists(impLibPath);
  }

  const std::string objPath = GetGeneratorTarget()->GetSupportDirectory();
  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  EnsureDirectoryExists(objPath);

  this->SetMsvcTargetPdbVariable(vars);

  if (globalGen->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::string& linkLibraries = vars["LINK_LIBRARIES"];
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::string& link_path = vars["LINK_PATH"];
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  // Device linking currently doesn't support response files so
  // do not check if the user has explicitly forced a response file.
  int const commandLineLengthLimit =
    static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
    globalGen->GetRuleCmdLength(this->LanguageLinkerDeviceRule());

  build.RspFile = this->ConvertToNinjaPath(std::string("CMakeFiles/") +
                                           genTarget->GetName() + ".rsp");

  // Gather order-only dependencies.
  this->GetLocalGenerator()->AppendTargetDepends(this->GetGeneratorTarget(),
                                                 build.OrderOnlyDeps);

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen->WriteBuild(this->GetBuildFileStream(), build,
                        commandLineLengthLimit, &usedResponseFile);
  this->WriteDeviceLinkRule(usedResponseFile);
}